

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpegd_parser.c
# Opt level: O0

MPP_RET jpegd_skip_section(JpegdCtx *ctx)

{
  BitReadCtx_t *gb_00;
  RK_U16 RVar1;
  MPP_RET MVar2;
  RK_U16 len;
  BitReadCtx_t *gb;
  JpegdCtx *ctx_local;
  
  gb_00 = ctx->bit_ctx;
  if (gb_00->bytes_left_ < 2) {
    ctx_local._4_4_ = MPP_ERR_READ_BIT;
  }
  else {
    RVar1 = jpegd_read_len(gb_00);
    if ((RVar1 < 2) || (gb_00->bytes_left_ < RVar1 - 2)) {
      ctx_local._4_4_ = MPP_ERR_READ_BIT;
    }
    else {
      if (2 < RVar1) {
        MVar2 = mpp_skip_longbits(gb_00,(RVar1 - 2) * 8);
        gb_00->ret = MVar2;
        if (gb_00->ret != MPP_OK) {
          return MPP_NOK;
        }
      }
      ctx_local._4_4_ = MPP_OK;
    }
  }
  return ctx_local._4_4_;
}

Assistant:

static MPP_RET jpegd_skip_section(JpegdCtx *ctx)
{
    BitReadCtx_t *gb = ctx->bit_ctx;
    RK_U16 len = 0;

    if (gb->bytes_left_ < 2)
        return MPP_ERR_READ_BIT;
    len = jpegd_read_len(gb);
    if (len < 2 /* invalid marker */ || (RK_U32)len - 2 > gb->bytes_left_) {
        /* too short length or bytes is not enough */
        return MPP_ERR_READ_BIT;
    }
    if (len > 2)
        SKIP_BITS(gb, (len - 2) * 8);

    return MPP_OK;

__BITREAD_ERR:
    return MPP_NOK;
}